

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

CURLcode process_zlib_error(Curl_easy *data,z_stream *z)

{
  CURLcode extraout_EAX;
  CURLcode extraout_EAX_00;
  
  if (z != (z_stream *)0x0) {
    Curl_failf(data,"Error while processing content unencoding: %s",z);
    return extraout_EAX;
  }
  Curl_failf(data,
             "Error while processing content unencoding: Unknown failure within decompression software."
            );
  return extraout_EAX_00;
}

Assistant:

static CURLcode
process_zlib_error(struct Curl_easy *data, z_stream *z)
{
  if(z->msg)
    failf(data, "Error while processing content unencoding: %s",
          z->msg);
  else
    failf(data, "Error while processing content unencoding: "
          "Unknown failure within decompression software.");

  return CURLE_BAD_CONTENT_ENCODING;
}